

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBJMeshFileLoader.cpp
# Opt level: O1

c8 * __thiscall
irr::scene::COBJMeshFileLoader::readColor
          (COBJMeshFileLoader *this,c8 *bufPtr,SColor *color,c8 *bufEnd)

{
  c8 *pcVar1;
  float fVar2;
  float ret;
  c8 colStr [16];
  float local_4c;
  c8 local_48 [24];
  
  pcVar1 = goAndCopyNextWord(this,local_48,bufPtr,0x10,bufEnd);
  core::fast_atof_move(local_48,(f32 *)&local_4c);
  fVar2 = floorf(local_4c * 255.0 + 0.5);
  *(char *)((long)&color->color + 2) = (char)(int)fVar2;
  pcVar1 = goAndCopyNextWord(this,local_48,pcVar1,0x10,bufEnd);
  core::fast_atof_move(local_48,(f32 *)&local_4c);
  fVar2 = floorf(local_4c * 255.0 + 0.5);
  *(char *)((long)&color->color + 1) = (char)(int)fVar2;
  pcVar1 = goAndCopyNextWord(this,local_48,pcVar1,0x10,bufEnd);
  core::fast_atof_move(local_48,(f32 *)&local_4c);
  fVar2 = floorf(local_4c * 255.0 + 0.5);
  *(char *)&color->color = (char)(int)fVar2;
  return pcVar1;
}

Assistant:

const c8 *COBJMeshFileLoader::readColor(const c8 *bufPtr, video::SColor &color, const c8 *const bufEnd)
{
	const u32 COLOR_BUFFER_LENGTH = 16;
	c8 colStr[COLOR_BUFFER_LENGTH];

	bufPtr = goAndCopyNextWord(colStr, bufPtr, COLOR_BUFFER_LENGTH, bufEnd);
	color.setRed((u32)core::round32(core::fast_atof(colStr) * 255.f));
	bufPtr = goAndCopyNextWord(colStr, bufPtr, COLOR_BUFFER_LENGTH, bufEnd);
	color.setGreen((u32)core::round32(core::fast_atof(colStr) * 255.f));
	bufPtr = goAndCopyNextWord(colStr, bufPtr, COLOR_BUFFER_LENGTH, bufEnd);
	color.setBlue((u32)core::round32(core::fast_atof(colStr) * 255.f));
	return bufPtr;
}